

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

ssize_t fd_write(hFILE *fpv,void *buffer,size_t nbytes)

{
  int *piVar1;
  bool bVar2;
  long local_38;
  ssize_t n;
  hFILE_fd *fp;
  size_t nbytes_local;
  void *buffer_local;
  hFILE *fpv_local;
  
  do {
    if ((char)(*(char *)((long)&fpv[1].buffer + 4) << 7) < '\0') {
      local_38 = send(*(int *)&fpv[1].buffer,buffer,nbytes,0);
    }
    else {
      local_38 = write(*(int *)&fpv[1].buffer,buffer,nbytes);
    }
    bVar2 = false;
    if (local_38 < 0) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 4;
    }
  } while (bVar2);
  return local_38;
}

Assistant:

static ssize_t fd_write(hFILE *fpv, const void *buffer, size_t nbytes)
{
    hFILE_fd *fp = (hFILE_fd *) fpv;
    ssize_t n;
    do {
        n = fp->is_socket?  send(fp->fd, buffer, nbytes, 0)
                         : write(fp->fd, buffer, nbytes);
    } while (n < 0 && errno == EINTR);
    return n;
}